

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

void whisper_kv_cache_seq_rm
               (whisper_kv_cache *cache,whisper_seq_id seq_id,whisper_pos p0,whisper_pos p1)

{
  _Base_ptr p_Var1;
  pointer pwVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  _Base_ptr p_Var6;
  int iVar7;
  ulong uVar8;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar9;
  int local_34;
  
  uVar5 = cache->size;
  iVar7 = 0;
  if (0 < p0) {
    iVar7 = p0;
  }
  if (uVar5 == 0) {
    uVar3 = 0;
  }
  else {
    uVar8 = 0;
    local_34 = seq_id;
    do {
      pwVar2 = (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pwVar2[uVar8].pos != 0x7fffffff && iVar7 <= pwVar2[uVar8].pos) {
        if (local_34 < 0) {
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                    (&pwVar2[uVar8].seq_id._M_t);
        }
        else {
          p_Var1 = (_Base_ptr)((long)&pwVar2[uVar8].seq_id._M_t._M_impl + 8);
          p_Var4 = p_Var1;
          for (p_Var6 = *(_Base_ptr *)((long)&pwVar2[uVar8].seq_id._M_t._M_impl + 0x10);
              p_Var6 != (_Base_ptr)0x0;
              p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < local_34]) {
            if (local_34 <= (int)p_Var6[1]._M_color) {
              p_Var4 = p_Var6;
            }
          }
          p_Var6 = p_Var1;
          if ((p_Var4 != p_Var1) && (p_Var6 = p_Var4, local_34 < (int)p_Var4[1]._M_color)) {
            p_Var6 = p_Var1;
          }
          if (p_Var6 == p_Var1) goto LAB_00132269;
          pVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::equal_range(&pwVar2[uVar8].seq_id._M_t,&local_34);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_erase_aux(&pwVar2[uVar8].seq_id._M_t,(_Base_ptr)pVar9.first._M_node,
                       (_Base_ptr)pVar9.second._M_node);
        }
        pwVar2 = (cache->cells).
                 super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(size_t *)((long)&pwVar2[uVar8].seq_id._M_t._M_impl + 0x28) == 0) {
          pwVar2[uVar8].pos = -1;
          if (uVar5 == cache->size) {
            uVar5 = (uint)uVar8;
          }
        }
      }
LAB_00132269:
      uVar8 = uVar8 + 1;
      uVar3 = cache->size;
    } while (uVar8 < uVar3);
  }
  if (uVar5 != uVar3) {
    cache->head = uVar5;
  }
  return;
}

Assistant:

static void whisper_kv_cache_seq_rm(
        struct whisper_kv_cache & cache,
                 whisper_seq_id   seq_id,
                    whisper_pos   p0,
                    whisper_pos   p1) {
    uint32_t new_head = cache.size;

    if (p0 < 0) p0 = 0;
    if (p1 < 0) p1 = std::numeric_limits<whisper_pos>::max();

    for (uint32_t i = 0; i < cache.size; ++i) {
        if (cache.cells[i].pos >= p0 && cache.cells[i].pos < p1) {
            if (seq_id < 0) {
                cache.cells[i].seq_id.clear();
            } else if (cache.cells[i].has_seq_id(seq_id)) {
                cache.cells[i].seq_id.erase(seq_id);
            } else {
                continue;
            }
            if (cache.cells[i].seq_id.empty()) {
                cache.cells[i].pos = -1;
                if (new_head == cache.size) new_head = i;
            }
        }
    }

    // If we freed up a slot, set head to it so searching can start there.
    if (new_head != cache.size) cache.head = new_head;
}